

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O2

void __thiscall
Assimp::ObjFileParser::getTwoVectors3
          (ObjFileParser *this,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *point3d_array_a,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *point3d_array_b)

{
  char *pBuffer;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var1;
  ai_real aVar2;
  ai_real aVar3;
  aiVector3t<float> local_34;
  
  pBuffer = this->m_buffer;
  copyNextWord(this,pBuffer,0x1000);
  aVar2 = fast_atof(pBuffer);
  copyNextWord(this,pBuffer,0x1000);
  aVar3 = fast_atof(pBuffer);
  copyNextWord(this,pBuffer,0x1000);
  local_34.z = fast_atof(pBuffer);
  local_34.x = aVar2;
  local_34.y = aVar3;
  std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::emplace_back<aiVector3t<float>>
            ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)point3d_array_a,
             &local_34);
  copyNextWord(this,pBuffer,0x1000);
  aVar2 = fast_atof(pBuffer);
  copyNextWord(this,pBuffer,0x1000);
  aVar3 = fast_atof(pBuffer);
  copyNextWord(this,pBuffer,0x1000);
  local_34.z = fast_atof(pBuffer);
  local_34.x = aVar2;
  local_34.y = aVar3;
  std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::emplace_back<aiVector3t<float>>
            ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)point3d_array_b,
             &local_34);
  _Var1 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,&this->m_uiLine);
  (this->m_DataIt)._M_current = _Var1._M_current;
  return;
}

Assistant:

void ObjFileParser::getTwoVectors3( std::vector<aiVector3D> &point3d_array_a, std::vector<aiVector3D> &point3d_array_b ) {
    ai_real x, y, z;
    copyNextWord(m_buffer, Buffersize);
    x = (ai_real) fast_atof(m_buffer);

    copyNextWord(m_buffer, Buffersize);
    y = (ai_real) fast_atof(m_buffer);

    copyNextWord( m_buffer, Buffersize );
    z = ( ai_real ) fast_atof( m_buffer );

    point3d_array_a.push_back( aiVector3D( x, y, z ) );

    copyNextWord(m_buffer, Buffersize);
    x = (ai_real) fast_atof(m_buffer);

    copyNextWord(m_buffer, Buffersize);
    y = (ai_real) fast_atof(m_buffer);

    copyNextWord( m_buffer, Buffersize );
    z = ( ai_real ) fast_atof( m_buffer );

    point3d_array_b.push_back( aiVector3D( x, y, z ) );

    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}